

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

char * read_referenced_name
                 (dwarf_data *ddata,unit *u,uint64_t offset,backtrace_error_callback error_callback,
                 void *data)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *name;
  char *s;
  attr_val val;
  size_t i;
  char *ret;
  abbrev *abbrev;
  uint64_t code;
  dwarf_buf unit_buf;
  void *data_local;
  backtrace_error_callback error_callback_local;
  uint64_t offset_local;
  unit *u_local;
  dwarf_data *ddata_local;
  
  unit_buf._56_8_ = data;
  if ((offset < u->unit_data_offset) || (u->unit_data_len <= offset - u->unit_data_offset)) {
    (*error_callback)(data,"abstract origin or specification out of range",0);
    ddata_local = (dwarf_data *)0x0;
  }
  else {
    lVar2 = offset - u->unit_data_offset;
    code = (uint64_t)anon_var_dwarf_55dd0;
    unit_buf.name = (char *)(ddata->dwarf_sections).data[0];
    unit_buf.start = u->unit_data + lVar2;
    unit_buf.buf = (uchar *)(u->unit_data_len - lVar2);
    unit_buf.left._0_4_ = ddata->is_bigendian;
    unit_buf.data._0_4_ = 0;
    unit_buf._32_8_ = error_callback;
    unit_buf.error_callback = (backtrace_error_callback)data;
    abbrev = (abbrev *)read_uleb128((dwarf_buf *)&code);
    if (abbrev == (abbrev *)0x0) {
      dwarf_buf_error((dwarf_buf *)&code,"invalid abstract origin or specification",0);
      ddata_local = (dwarf_data *)0x0;
    }
    else {
      ret = (char *)lookup_abbrev(&u->abbrevs,(uint64_t)abbrev,error_callback,
                                  (void *)unit_buf._56_8_);
      if ((abbrev *)ret == (abbrev *)0x0) {
        ddata_local = (dwarf_data *)0x0;
      }
      else {
        i = 0;
        for (val.u.uint = 0; val.u.uint < *(ulong *)(ret + 0x10);
            val.u.string = (char *)(val.u.uint + 1)) {
          iVar1 = read_attribute(*(dwarf_form *)(*(long *)(ret + 0x18) + val.u.uint * 0x10 + 4),
                                 *(uint64_t *)(*(long *)(ret + 0x18) + val.u.uint * 0x10 + 8),
                                 (dwarf_buf *)&code,u->is_dwarf64,u->version,u->addrsize,
                                 &ddata->dwarf_sections,ddata->altlink,(attr_val *)&s);
          if (iVar1 == 0) {
            return (char *)0x0;
          }
          iVar1 = *(int *)(*(long *)(ret + 0x18) + val.u.uint * 0x10);
          if (iVar1 == 3) {
            if ((i == 0) &&
               (iVar1 = resolve_string(&ddata->dwarf_sections,u->is_dwarf64,ddata->is_bigendian,
                                       u->str_offsets_base,(attr_val *)&s,error_callback,
                                       (void *)unit_buf._56_8_,(char **)&i), iVar1 == 0)) {
              return (char *)0x0;
            }
          }
          else if (iVar1 == 0x47) {
            pcVar3 = read_referenced_name_from_attr
                               (ddata,u,(attr *)(*(long *)(ret + 0x18) + val.u.uint * 0x10),
                                (attr_val *)&s,error_callback,(void *)unit_buf._56_8_);
            if (pcVar3 != (char *)0x0) {
              i = (size_t)pcVar3;
            }
          }
          else if ((iVar1 == 0x6e) || (iVar1 == 0x2007)) {
            name = (char *)0x0;
            iVar1 = resolve_string(&ddata->dwarf_sections,u->is_dwarf64,ddata->is_bigendian,
                                   u->str_offsets_base,(attr_val *)&s,error_callback,
                                   (void *)unit_buf._56_8_,&name);
            if (iVar1 == 0) {
              return (char *)0x0;
            }
            if (name != (char *)0x0) {
              return name;
            }
          }
        }
        ddata_local = (dwarf_data *)i;
      }
    }
  }
  return (char *)ddata_local;
}

Assistant:

static const char *
read_referenced_name (struct dwarf_data *ddata, struct unit *u,
		      uint64_t offset, backtrace_error_callback error_callback,
		      void *data)
{
  struct dwarf_buf unit_buf;
  uint64_t code;
  const struct abbrev *abbrev;
  const char *ret;
  size_t i;

  /* OFFSET is from the start of the data for this compilation unit.
     U->unit_data is the data, but it starts U->unit_data_offset bytes
     from the beginning.  */

  if (offset < u->unit_data_offset
      || offset - u->unit_data_offset >= u->unit_data_len)
    {
      error_callback (data,
		      "abstract origin or specification out of range",
		      0);
      return NULL;
    }

  offset -= u->unit_data_offset;

  unit_buf.name = ".debug_info";
  unit_buf.start = ddata->dwarf_sections.data[DEBUG_INFO];
  unit_buf.buf = u->unit_data + offset;
  unit_buf.left = u->unit_data_len - offset;
  unit_buf.is_bigendian = ddata->is_bigendian;
  unit_buf.error_callback = error_callback;
  unit_buf.data = data;
  unit_buf.reported_underflow = 0;

  code = read_uleb128 (&unit_buf);
  if (code == 0)
    {
      dwarf_buf_error (&unit_buf,
		       "invalid abstract origin or specification",
		       0);
      return NULL;
    }

  abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
  if (abbrev == NULL)
    return NULL;

  ret = NULL;
  for (i = 0; i < abbrev->num_attrs; ++i)
    {
      struct attr_val val;

      if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			   &unit_buf, u->is_dwarf64, u->version, u->addrsize,
			   &ddata->dwarf_sections, ddata->altlink, &val))
	return NULL;

      switch (abbrev->attrs[i].name)
	{
	case DW_AT_name:
	  /* Third name preference: don't override.  A name we found in some
	     other way, will normally be more useful -- e.g., this name is
	     normally not mangled.  */
	  if (ret != NULL)
	    break;
	  if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
			       ddata->is_bigendian, u->str_offsets_base,
			       &val, error_callback, data, &ret))
	    return NULL;
	  break;

	case DW_AT_linkage_name:
	case DW_AT_MIPS_linkage_name:
	  /* First name preference: override all.  */
	  {
	    const char *s;

	    s = NULL;
	    if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
				 ddata->is_bigendian, u->str_offsets_base,
				 &val, error_callback, data, &s))
	      return NULL;
	    if (s != NULL)
	      return s;
	  }
	  break;

	case DW_AT_specification:
	  /* Second name preference: override DW_AT_name, don't override
	     DW_AT_linkage_name.  */
	  {
	    const char *name;

	    name = read_referenced_name_from_attr (ddata, u, &abbrev->attrs[i],
						   &val, error_callback, data);
	    if (name != NULL)
	      ret = name;
	  }
	  break;

	default:
	  break;
	}
    }

  return ret;
}